

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.h
# Opt level: O0

Result<Sample> * __thiscall
vkb::Result<Sample>::operator=(Result<Sample> *this,Result<Sample> *result)

{
  Result<Sample> *result_local;
  Result<Sample> *this_local;
  
  destroy(this);
  this->m_init = (bool)(result->m_init & 1);
  if ((this->m_init & 1U) == 0) {
    (this->field_0).m_value._vptr_Sample = (result->field_0).m_value._vptr_Sample;
    (this->field_0).m_value.data = (result->field_0).m_value.data;
    (this->field_0).m_error.vk_result = (result->field_0).m_error.vk_result;
  }
  else {
    Sample::Sample((Sample *)this,(Sample *)result);
  }
  return this;
}

Assistant:

Result& operator=(Result const& result) noexcept {
        destroy();
        m_init = result.m_init;
        if (m_init)
            new (&m_value) T{ result.m_value };
        else
            m_error = result.m_error;
        return *this;
    }